

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  String *in_stack_ffffffffffffff10;
  String *this_00;
  undefined1 local_90 [4];
  int num_disabled;
  int local_80;
  uint local_7c;
  int failed_test_count;
  int num_failures;
  TimeInMillis local_68;
  String local_60;
  String local_50 [2];
  String local_30;
  int local_1c;
  UnitTest *pUStack_18;
  int param_2_local;
  UnitTest *unit_test_local;
  PrettyUnitTestResultPrinter *this_local;
  
  local_1c = param_2;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  iVar2 = UnitTest::test_to_run_count(pUStack_18);
  FormatTestCount((testing *)&local_30,iVar2);
  pcVar4 = String::c_str(&local_30);
  iVar2 = UnitTest::test_case_to_run_count(pUStack_18);
  FormatTestCaseCount((testing *)local_50,iVar2);
  pcVar5 = String::c_str(local_50);
  printf("%s from %s ran.",pcVar4,pcVar5);
  String::~String(in_stack_ffffffffffffff10);
  String::~String(in_stack_ffffffffffffff10);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    local_68 = UnitTest::elapsed_time(pUStack_18);
    StreamableToString<long_long>((internal *)&local_60,&local_68);
    pcVar4 = String::c_str(&local_60);
    printf(" (%s ms total)",pcVar4);
    String::~String(in_stack_ffffffffffffff10);
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  iVar2 = UnitTest::successful_test_count(pUStack_18);
  FormatTestCount((testing *)&failed_test_count,iVar2);
  pcVar4 = String::c_str((String *)&failed_test_count);
  printf("%s.\n",pcVar4);
  String::~String(in_stack_ffffffffffffff10);
  local_7c = UnitTest::failed_test_count(pUStack_18);
  bVar1 = UnitTest::Passed(pUStack_18);
  if (!bVar1) {
    local_80 = UnitTest::failed_test_count(pUStack_18);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    this_00 = (String *)local_90;
    FormatTestCount((testing *)this_00,local_80);
    pcVar4 = String::c_str(this_00);
    printf("%s, listed below:\n",pcVar4);
    String::~String(this_00);
    PrintFailedTests(pUStack_18);
    pcVar4 = "TESTS";
    if (local_7c == 1) {
      pcVar4 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)local_7c,pcVar4);
  }
  uVar3 = UnitTest::disabled_test_count(pUStack_18);
  if ((uVar3 != 0) && ((FLAGS_gtest_also_run_disabled_tests & 1) == 0)) {
    if (local_7c == 0) {
      printf("\n");
    }
    pcVar4 = "TESTS";
    if (uVar3 == 1) {
      pcVar4 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar3,pcVar4);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}